

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ixgbe.cpp
# Opt level: O3

void __thiscall ixy::IxgbeDevice::reset_stats(IxgbeDevice *this)

{
  if ((((0x4073 < this->len - 4) && (0x407f < this->len - 4)) && (0x4087 < this->len - 4)) &&
     (((0x408b < this->len - 4 && (0x408f < this->len - 4)) && (0x4093 < this->len - 4)))) {
    return;
  }
  __assert_fail("reg <= len - 4",
                "/workspace/llm4binary/github/license_c_cmakelists/ixy-languages[P]ixy/src/ixgbe.cpp"
                ,0x1cb,"uint32_t ixy::IxgbeDevice::get_reg32(uint64_t)");
}

Assistant:

void IxgbeDevice::reset_stats() {
    get_reg32(IXGBE_GPRC);
    get_reg32(IXGBE_GPTC);
    get_reg32(IXGBE_GORCL);
    get_reg32(IXGBE_GORCH);
    get_reg32(IXGBE_GOTCL);
    get_reg32(IXGBE_GOTCH);
}